

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

int Search::select_learner
              (search_private *priv,int policy,size_t learner_id,bool is_training,bool is_local)

{
  int iVar1;
  
  iVar1 = (int)learner_id;
  if (-1 < policy) {
    if (priv->xv == true) {
      iVar1 = iVar1 * 3;
      if (!is_local) {
        iVar1 = iVar1 + ((uint)priv->all->sd->example_number & 1 ^ (uint)is_training) + 1;
      }
    }
    policy = iVar1 + policy * (int)priv->num_learners;
  }
  return policy;
}

Assistant:

int select_learner(search_private& priv, int policy, size_t learner_id, bool is_training, bool is_local)
{
  if (policy < 0)
    return policy;  // optimal policy
  else
  {
    if (priv.xv)
    {
      learner_id *= 3;
      if (!is_local)
        learner_id += 1 + (size_t)(is_training ^ (priv.all->sd->example_number % 2 == 1));
    }
    int p = (int)(policy * priv.num_learners + learner_id);
    return p;
  }
}